

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ui-prefs.c
# Opt level: O0

void option_dump(ang_file *fff)

{
  uint local_18;
  uint local_14;
  wchar_t j;
  wchar_t i;
  ang_file *fff_local;
  
  file_putf(fff,"# Options\n\n");
  for (local_14 = 1; (int)local_14 < 8; local_14 = local_14 + 1) {
    if (angband_term[(int)local_14] != (term *)0x0) {
      for (local_18 = 0; (int)local_18 < 0x20; local_18 = local_18 + 1) {
        if ((window_flag_desc[(int)local_18] != (char *)0x0) &&
           ((window_flag[(int)local_14] & 1 << ((byte)local_18 & 0x1f)) != 0)) {
          file_putf(fff,"# Window \'%s\', Flag \'%s\'\n",angband_term_name + (int)local_14,
                    window_flag_desc[(int)local_18]);
          file_putf(fff,"window:%d:%d:1\n",(ulong)local_14,(ulong)local_18);
          file_putf(fff,"\n");
        }
      }
    }
  }
  return;
}

Assistant:

void option_dump(ang_file *fff)
{
	int i, j;

	file_putf(fff, "# Options\n\n");

	/* Dump window flags */
	for (i = 1; i < ANGBAND_TERM_MAX; i++) {
		/* Require a real window */
		if (!angband_term[i]) continue;

		/* Check each flag */
		for (j = 0; j < (int)N_ELEMENTS(window_flag_desc); j++) {
			/* Require a real flag */
			if (!window_flag_desc[j]) continue;

			/* Only dump the flag if true */
			if (window_flag[i] & (((uint32_t) 1) << j)) {
				file_putf(fff, "# Window '%s', Flag '%s'\n",
						  angband_term_name[i], window_flag_desc[j]);
				file_putf(fff, "window:%d:%d:1\n", i, j);

				/* Skip a line */
				file_putf(fff, "\n");
			}
		}
	}
}